

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void Assimp::FBX::ParseVectorDataArray
               (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *out,Element *el)

{
  pointer *ppaVar1;
  Token *t;
  pointer ppTVar2;
  iterator iVar3;
  char *end;
  size_t __n;
  Scope *sc;
  Element *pEVar4;
  Element *in_R9;
  undefined1 auVar5 [8];
  pointer ppTVar6;
  uint uVar7;
  ulong __n_00;
  float fVar8;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_79;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  char *local_40;
  uint local_34;
  
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(out,0);
  ppTVar6 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar6 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_78 = (undefined1  [8])&local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"unexpected empty element","");
    anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
  }
  t = *ppTVar6;
  if (t->column == 0xffffffff) {
    local_40 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_40,end,(char *)&local_79,&local_34,el);
    if ((local_34 & 3) != 0) {
      local_78 = (undefined1  [8])&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"number of floats is not a multiple of four (4) (binary)","");
      anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
    }
    if (local_34 != 0) {
      if ((local_79 & 0xfd) != 100) {
        local_78 = (undefined1  [8])&local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"expected float or double array (binary)","");
        anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
      }
      local_78 = (undefined1  [8])0x0;
      uStack_70 = (pointer)0x0;
      local_68._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_79,local_34,&local_40,end,(vector<char,_std::allocator<char>_> *)local_78,
                 in_R9);
      __n_00 = (ulong)(local_34 >> 2);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(out,__n_00);
      if (local_79 == 0x66) {
        auVar5 = local_78;
        do {
          local_58 = *(double *)auVar5;
          uStack_50 = *(double *)((long)auVar5 + 8);
          iVar3._M_current =
               (out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)out,iVar3,
                       (aiColor4t<float> *)&local_58);
          }
          else {
            *(double *)iVar3._M_current = local_58;
            *(double *)&(iVar3._M_current)->b = uStack_50;
            ppaVar1 = &(out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          auVar5 = (undefined1  [8])((long)auVar5 + 0x10);
          uVar7 = (int)__n_00 - 1;
          __n_00 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      else if (local_79 == 100) {
        auVar5 = local_78;
        do {
          local_58 = (double)CONCAT44((float)*(double *)((long)auVar5 + 8),(float)*(double *)auVar5)
          ;
          uStack_50 = (double)CONCAT44((float)*(double *)((long)auVar5 + 0x18),
                                       (float)*(double *)((long)auVar5 + 0x10));
          iVar3._M_current =
               (out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)out,iVar3,
                       (aiColor4t<float> *)&local_58);
          }
          else {
            *(double *)iVar3._M_current = local_58;
            *(double *)&(iVar3._M_current)->b = uStack_50;
            ppaVar1 = &(out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          auVar5 = (undefined1  [8])((long)auVar5 + 0x20);
          uVar7 = (int)__n_00 - 1;
          __n_00 = (ulong)uVar7;
        } while (uVar7 != 0);
      }
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78);
      }
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    local_78 = (undefined1  [8])&local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"a","");
    pEVar4 = GetRequiredElement(sc,(string *)local_78,el);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
    ppTVar6 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (((int)ppTVar2 - (int)ppTVar6 & 0x18U) != 0) {
      local_78 = (undefined1  [8])&local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"number of floats is not a multiple of four (4)","");
      anon_unknown.dwarf_224f1b::ParseError((string *)local_78,el);
    }
    if (ppTVar6 != ppTVar2) {
      do {
        local_78 = (undefined1  [8])0x0;
        uStack_70 = (pointer)0x0;
        fVar8 = ParseTokenAsFloat(*ppTVar6);
        local_78._0_4_ = fVar8;
        fVar8 = ParseTokenAsFloat(ppTVar6[1]);
        local_78._4_4_ = fVar8;
        fVar8 = ParseTokenAsFloat(ppTVar6[2]);
        uStack_70 = (pointer)CONCAT44(uStack_70._4_4_,fVar8);
        fVar8 = ParseTokenAsFloat(ppTVar6[3]);
        uStack_70 = (pointer)CONCAT44(fVar8,(float)uStack_70);
        iVar3._M_current =
             (out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
          _M_realloc_insert<aiColor4t<float>const&>
                    ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)out,iVar3,
                     (aiColor4t<float> *)local_78);
        }
        else {
          (iVar3._M_current)->r = (float)local_78._0_4_;
          (iVar3._M_current)->g = (float)local_78._4_4_;
          *(pointer *)&(iVar3._M_current)->b = uStack_70;
          ppaVar1 = &(out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        ppTVar6 = ppTVar6 + 4;
      } while (ppTVar6 != ppTVar2);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiColor4D>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 4 != 0) {
            ParseError("number of floats is not a multiple of four (4) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count4 = count / 4;
        out.reserve(count4);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count4; ++i, d += 4) {
                out.push_back(aiColor4D(static_cast<float>(d[0]),
                    static_cast<float>(d[1]),
                    static_cast<float>(d[2]),
                    static_cast<float>(d[3])));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count4; ++i, f += 4) {
                out.push_back(aiColor4D(f[0],f[1],f[2],f[3]));
            }
        }
        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    //  see notes in ParseVectorDataArray() above
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 4 != 0) {
        ParseError("number of floats is not a multiple of four (4)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiColor4D v;
        v.r = ParseTokenAsFloat(**it++);
        v.g = ParseTokenAsFloat(**it++);
        v.b = ParseTokenAsFloat(**it++);
        v.a = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}